

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_ahref(jit_State *J,IRIns *refa,IRIns *refb)

{
  ushort uVar1;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  IRRef baseb;
  IRRef basea;
  int32_t ofsb;
  int32_t ofsa;
  IRRef tb;
  IRRef ta;
  IRIns *keyb;
  IRIns *keya;
  IRRef kb;
  IRRef ka;
  IRIns *refb_local;
  IRIns *refa_local;
  jit_State *J_local;
  
  keya._4_4_ = (uint)(refa->field_0).op2;
  keya._0_4_ = (uint)(refb->field_0).op2;
  if (refa == refb) {
    J_local._4_4_ = ALIAS_MUST;
  }
  else {
    keyb = (J->cur).ir + keya._4_4_;
    if ((keyb->field_1).o == '\x1e') {
      keya._4_4_ = (uint)(keyb->field_0).op1;
      keyb = (J->cur).ir + keya._4_4_;
    }
    _tb = (J->cur).ir + (uint)keya;
    if ((_tb->field_1).o == '\x1e') {
      keya._0_4_ = (uint)(_tb->field_0).op1;
      _tb = (J->cur).ir + (uint)keya;
    }
    if (((refa->field_1).o == '9') || ((refa->field_1).o == '8')) {
      uVar1 = (J->cur).ir[(refa->field_0).op1].field_0.op1;
    }
    else {
      uVar1 = (refa->field_0).op1;
    }
    local_5c = (uint)uVar1;
    if (((refb->field_1).o == '9') || ((refb->field_1).o == '8')) {
      uVar1 = (J->cur).ir[(refb->field_0).op1].field_0.op1;
    }
    else {
      uVar1 = (refb->field_0).op1;
    }
    local_60 = (uint)uVar1;
    if (keya._4_4_ == (uint)keya) {
      if (local_5c == local_60) {
        J_local._4_4_ = ALIAS_MUST;
      }
      else {
        J_local._4_4_ = aa_table(J,local_5c,local_60);
      }
    }
    else if ((keya._4_4_ < 0x8000) && ((uint)keya < 0x8000)) {
      J_local._4_4_ = ALIAS_NO;
    }
    else {
      if ((refa->field_1).o == '8') {
        basea = 0;
        baseb = 0;
        local_54 = keya._4_4_;
        local_58 = (uint)keya;
        if (((keyb->field_1).o == ')') && ((keyb->field_0).op2 < 0x8000)) {
          local_54 = (uint)(keyb->field_0).op1;
          basea = (J->cur).ir[(keyb->field_0).op2].field_1.op12;
          if ((local_54 == (uint)keya) && (basea != 0)) {
            return ALIAS_NO;
          }
        }
        if (((_tb->field_1).o == ')') && ((_tb->field_0).op2 < 0x8000)) {
          local_58 = (uint)(_tb->field_0).op1;
          baseb = (J->cur).ir[(_tb->field_0).op2].field_1.op12;
          if ((keya._4_4_ == local_58) && (baseb != 0)) {
            return ALIAS_NO;
          }
        }
        if ((local_54 == local_58) && (basea != baseb)) {
          return ALIAS_NO;
        }
      }
      else if ((((keyb->field_1).t.irt ^ (_tb->field_1).t.irt) & 0x1f) != 0) {
        return ALIAS_NO;
      }
      if (local_5c == local_60) {
        J_local._4_4_ = ALIAS_MAY;
      }
      else {
        J_local._4_4_ = aa_table(J,local_5c,local_60);
      }
    }
  }
  return J_local._4_4_;
}

Assistant:

static AliasRet aa_ahref(jit_State *J, IRIns *refa, IRIns *refb)
{
  IRRef ka = refa->op2;
  IRRef kb = refb->op2;
  IRIns *keya, *keyb;
  IRRef ta, tb;
  if (refa == refb)
    return ALIAS_MUST;  /* Shortcut for same refs. */
  keya = IR(ka);
  if (keya->o == IR_KSLOT) { ka = keya->op1; keya = IR(ka); }
  keyb = IR(kb);
  if (keyb->o == IR_KSLOT) { kb = keyb->op1; keyb = IR(kb); }
  ta = (refa->o==IR_HREFK || refa->o==IR_AREF) ? IR(refa->op1)->op1 : refa->op1;
  tb = (refb->o==IR_HREFK || refb->o==IR_AREF) ? IR(refb->op1)->op1 : refb->op1;
  if (ka == kb) {
    /* Same key. Check for same table with different ref (NEWREF vs. HREF). */
    if (ta == tb)
      return ALIAS_MUST;  /* Same key, same table. */
    else
      return aa_table(J, ta, tb);  /* Same key, possibly different table. */
  }
  if (irref_isk(ka) && irref_isk(kb))
    return ALIAS_NO;  /* Different constant keys. */
  if (refa->o == IR_AREF) {
    /* Disambiguate array references based on index arithmetic. */
    int32_t ofsa = 0, ofsb = 0;
    IRRef basea = ka, baseb = kb;
    lj_assertJ(refb->o == IR_AREF, "expected AREF");
    /* Gather base and offset from t[base] or t[base+-ofs]. */
    if (keya->o == IR_ADD && irref_isk(keya->op2)) {
      basea = keya->op1;
      ofsa = IR(keya->op2)->i;
      if (basea == kb && ofsa != 0)
	return ALIAS_NO;  /* t[base+-ofs] vs. t[base]. */
    }
    if (keyb->o == IR_ADD && irref_isk(keyb->op2)) {
      baseb = keyb->op1;
      ofsb = IR(keyb->op2)->i;
      if (ka == baseb && ofsb != 0)
	return ALIAS_NO;  /* t[base] vs. t[base+-ofs]. */
    }
    if (basea == baseb && ofsa != ofsb)
      return ALIAS_NO;  /* t[base+-o1] vs. t[base+-o2] and o1 != o2. */
  } else {
    /* Disambiguate hash references based on the type of their keys. */
    lj_assertJ((refa->o==IR_HREF || refa->o==IR_HREFK || refa->o==IR_NEWREF) &&
	       (refb->o==IR_HREF || refb->o==IR_HREFK || refb->o==IR_NEWREF),
	       "bad xREF IR op %d or %d", refa->o, refb->o);
    if (!irt_sametype(keya->t, keyb->t))
      return ALIAS_NO;  /* Different key types. */
  }
  if (ta == tb)
    return ALIAS_MAY;  /* Same table, cannot disambiguate keys. */
  else
    return aa_table(J, ta, tb);  /* Try to disambiguate tables. */
}